

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compute_sync_words.cc
# Opt level: O0

int main(int argc,char **argv)

{
  reference pvVar1;
  runtime_error *prVar2;
  byte *pbVar3;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this;
  int *in_RSI;
  undefined4 in_EDI;
  char (*unaff_retaddr) [107];
  char (*in_stack_00000008) [33];
  uint i_3;
  ssize_t rv_1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> buf_1;
  ssize_t len_1;
  array<unsigned_char,_4UL> nrzmSyncWord;
  uint i_2;
  uint i_1;
  uint i;
  ssize_t rv;
  vector<unsigned_char,_std::allocator<unsigned_char>_> buf;
  ssize_t len;
  array<unsigned_char,_4UL> syncWord;
  Viterbi v;
  uint8_t *in_stack_fffffffffffffe58;
  Viterbi *in_stack_fffffffffffffe60;
  pointer in_stack_fffffffffffffe68;
  Viterbi *in_stack_fffffffffffffe70;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_fffffffffffffe78;
  Viterbi *in_stack_fffffffffffffe80;
  uint local_114;
  string local_108 [32];
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_e8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_d8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_c0;
  _Type local_b4;
  undefined1 local_b0 [56];
  ssize_t local_78;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_68;
  ssize_t local_40;
  array<unsigned_char,_4UL> local_34 [9];
  int iVar4;
  
  iVar4 = 0;
  decoder::Viterbi::Viterbi(in_stack_fffffffffffffe80);
  pvVar1 = std::array<unsigned_char,_4UL>::operator[]
                     ((array<unsigned_char,_4UL> *)in_stack_fffffffffffffe60,
                      (size_type)in_stack_fffffffffffffe58);
  *pvVar1 = '\x1a';
  pvVar1 = std::array<unsigned_char,_4UL>::operator[]
                     ((array<unsigned_char,_4UL> *)in_stack_fffffffffffffe60,
                      (size_type)in_stack_fffffffffffffe58);
  *pvVar1 = 0xcf;
  pvVar1 = std::array<unsigned_char,_4UL>::operator[]
                     ((array<unsigned_char,_4UL> *)in_stack_fffffffffffffe60,
                      (size_type)in_stack_fffffffffffffe58);
  *pvVar1 = 0xfc;
  pvVar1 = std::array<unsigned_char,_4UL>::operator[]
                     ((array<unsigned_char,_4UL> *)in_stack_fffffffffffffe60,
                      (size_type)in_stack_fffffffffffffe58);
  *pvVar1 = '\x1d';
  std::array<unsigned_char,_4UL>::size(local_34);
  local_40 = decoder::Viterbi::encodeLength
                       (in_stack_fffffffffffffe60,(size_t)in_stack_fffffffffffffe58);
  std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)0x103488);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffe80,
             (size_type)in_stack_fffffffffffffe78,(allocator_type *)in_stack_fffffffffffffe70);
  std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x1034ae);
  std::array<unsigned_char,_4UL>::data((array<unsigned_char,_4UL> *)0x1034c0);
  std::array<unsigned_char,_4UL>::size(local_34);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x1034e1);
  local_78 = decoder::Viterbi::encode
                       (in_stack_fffffffffffffe70,in_stack_fffffffffffffe68,
                        (size_t)in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
  if (local_78 != local_40) {
    local_b0[0x13] = 1;
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_b0._20_4_ = 0x31;
    util::str<char[33],char[107],char[2],int>
              (in_stack_00000008,unaff_retaddr,(char (*) [2])CONCAT44(iVar4,in_EDI),in_RSI);
    std::runtime_error::runtime_error(prVar2,(string *)(local_b0 + 0x18));
    local_b0[0x13] = 0;
    __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  printf("LRIT:   phase 0: 0x");
  for (local_b0._12_4_ = 0; (uint)local_b0._12_4_ < 8; local_b0._12_4_ = local_b0._12_4_ + 1) {
    pbVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       (&local_68,(ulong)(uint)local_b0._12_4_);
    printf("%02x",(ulong)*pbVar3);
  }
  printf("\n");
  printf("LRIT: phase 180: 0x");
  for (local_b0._8_4_ = 0; (uint)local_b0._8_4_ < 8; local_b0._8_4_ = local_b0._8_4_ + 1) {
    pbVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       (&local_68,(ulong)(uint)local_b0._8_4_);
    printf("%02x",(ulong)(*pbVar3 ^ 0xff));
  }
  printf("\n");
  local_b0._4_4_ = 0;
  while( true ) {
    if (1 < (uint)local_b0._4_4_) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffe70)
      ;
      decoder::Viterbi::~Viterbi(in_stack_fffffffffffffe60);
      return iVar4;
    }
    local_b4[0] = local_34[0]._M_elems[0];
    local_b4[1] = local_34[0]._M_elems[1];
    local_b4[2] = local_34[0]._M_elems[2];
    local_b4[3] = local_34[0]._M_elems[3];
    local_b0._0_4_ =
         nrzmEncode((array<unsigned_char,_4UL>)SUB84(in_stack_fffffffffffffe70,0),
                    (int)((ulong)in_stack_fffffffffffffe68 >> 0x20));
    std::array<unsigned_char,_4UL>::size((array<unsigned_char,_4UL> *)local_b0);
    this = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
           decoder::Viterbi::encodeLength
                     (in_stack_fffffffffffffe60,(size_t)in_stack_fffffffffffffe58);
    local_c0 = this;
    std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)0x1037d7);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (this,(size_type)in_stack_fffffffffffffe78,(allocator_type *)in_stack_fffffffffffffe70
              );
    std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x1037fd);
    in_stack_fffffffffffffe60 = (Viterbi *)local_b0;
    in_stack_fffffffffffffe68 =
         std::array<unsigned_char,_4UL>::data((array<unsigned_char,_4UL> *)0x10380f);
    in_stack_fffffffffffffe70 =
         (Viterbi *)
         std::array<unsigned_char,_4UL>::size
                   ((array<unsigned_char,_4UL> *)in_stack_fffffffffffffe60);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x103830);
    in_stack_fffffffffffffe78 =
         (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
         decoder::Viterbi::encode
                   (in_stack_fffffffffffffe70,in_stack_fffffffffffffe68,
                    (size_t)in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
    local_e8 = in_stack_fffffffffffffe78;
    if (in_stack_fffffffffffffe78 != local_c0) break;
    if (local_b0._4_4_ == 0) {
      printf("HRIT:   phase 0: 0x");
    }
    else {
      printf("HRIT: phase 180: 0x");
    }
    for (local_114 = 0; local_114 < 8; local_114 = local_114 + 1) {
      pbVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         (&local_d8,(ulong)local_114);
      printf("%02x",(ulong)*pbVar3);
    }
    printf("\n");
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffe70);
    local_b0._4_4_ = local_b0._4_4_ + 1;
  }
  prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
  util::str<char[33],char[107],char[2],int>
            (in_stack_00000008,unaff_retaddr,(char (*) [2])CONCAT44(iVar4,in_EDI),in_RSI);
  std::runtime_error::runtime_error(prVar2,local_108);
  __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

int main(int argc, char** argv) {
  decoder::Viterbi v;

  // Use array of bytes instead of fundamental type so we
  // don't need to worry about host byte order.
  std::array<uint8_t, 4> syncWord;
  syncWord[0] = 0x1A;
  syncWord[1] = 0xCF;
  syncWord[2] = 0xFC;
  syncWord[3] = 0x1D;

  // LRIT uses NRZ-L "coding" (which is really no coding at all).
  // To get the encoded sync word we can directly Viterbi encode it.
  // Then we can invert it to get its dual to deal with phase
  // ambiguity.
  auto len = v.encodeLength(syncWord.size());
  std::vector<uint8_t> buf(len);
  auto rv = v.encode(syncWord.data(), syncWord.size(), buf.data());
  ASSERT(rv == len);

  // 0 degree phase shift
  printf("LRIT:   phase 0: 0x");
  for (unsigned i = 0; i < 8; i++) {
    printf("%02x", (uint8_t) buf[i]);
  }
  printf("\n");

  // 180 degree phase shift
  printf("LRIT: phase 180: 0x");
  for (unsigned i = 0; i < 8; i++) {
    printf("%02x", (uint8_t) ~buf[i]);
  }
  printf("\n");

  // HRIT uses NRZ-M coding. In this scheme, a 0 means no bit change,
  // and a 1 means a bit change. We have to get an encoded sync word
  // for 2 different initial states to deal with phase ambiguity.
  for (unsigned i = 0; i < 2; i++) {
    auto nrzmSyncWord = nrzmEncode(syncWord, i);
    auto len = v.encodeLength(nrzmSyncWord.size());
    std::vector<uint8_t> buf(len);
    auto rv = v.encode(nrzmSyncWord.data(), nrzmSyncWord.size(), buf.data());
    ASSERT(rv == len);

    if (i == 0) {
      // 0 degree phase shift
      printf("HRIT:   phase 0: 0x");
    } else {
      // 180 degree phase shift
      printf("HRIT: phase 180: 0x");
    }
    for (unsigned i = 0; i < 8; i++) {
      printf("%02x", (uint8_t) buf[i]);
    }
    printf("\n");
  }
}